

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteTranslational::IntLoadConstraint_C
          (ChLinkRevoluteTranslational *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp
          ,double recovery_clamp)

{
  ulong uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  uVar5 = (ulong)off_L;
  iVar4 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 == '\0') {
    return;
  }
  dVar13 = c * this->m_cur_par1;
  if (do_clamp) {
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_8_ = recovery_clamp;
    auVar9._8_8_ = recovery_clamp;
    auVar9._0_8_ = recovery_clamp;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar9,auVar7);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar13;
    auVar12 = vmaxsd_avx(auVar14,auVar7);
    auVar15._8_8_ = auVar7._0_8_;
    auVar15._0_8_ = auVar7._0_8_;
    auVar12 = vminsd_avx(auVar12,auVar3);
    dVar13 = auVar12._0_8_;
    auVar11._0_8_ = c * this->m_cur_par2;
    auVar11._8_8_ = c * this->m_cur_dot;
    auVar12 = vmaxpd_avx(auVar11,auVar15);
    auVar12 = vminpd_avx(auVar12,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (this->m_cur_dist - this->m_dist) * c;
    auVar7 = vmaxsd_avx(auVar10,auVar7);
    auVar7 = vminsd_avx(auVar7,auVar3);
    dVar8 = auVar7._0_8_;
  }
  else {
    auVar12._0_8_ = c * this->m_cur_par2;
    auVar12._8_8_ = c * this->m_cur_dot;
    dVar8 = (this->m_cur_dist - this->m_dist) * c;
  }
  uVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar5 < (long)uVar1) {
    pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[uVar5] = dVar13 + pdVar2[uVar5];
    uVar5 = (ulong)(off_L + 1);
    if (uVar5 < uVar1) {
      pdVar2[uVar5] = auVar12._0_8_ + pdVar2[uVar5];
      uVar5 = (ulong)(off_L + 2);
      if (uVar5 < uVar1) {
        auVar12 = vshufpd_avx(auVar12,auVar12,1);
        uVar6 = (ulong)(off_L + 3);
        pdVar2[uVar5] = auVar12._0_8_ + pdVar2[uVar5];
        if (uVar6 < uVar1) {
          pdVar2[uVar6] = dVar8 + pdVar2[uVar6];
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkRevoluteTranslational::IntLoadConstraint_C(const unsigned int off_L,
                                                      ChVectorDynamic<>& Qc,   
                                                      const double c,          
                                                      bool do_clamp,           
                                                      double recovery_clamp    
                                                      ) {
    if (!IsActive())
        return;

    double cnstr_par1_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_par1, -recovery_clamp), recovery_clamp) : c * m_cur_par1;
    double cnstr_par2_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_par2, -recovery_clamp), recovery_clamp) : c * m_cur_par2;
    double cnstr_dot_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_dot, -recovery_clamp), recovery_clamp) : c * m_cur_dot;
    double cnstr_dist_violation =
        do_clamp ? ChMin(ChMax(c * (m_cur_dist - m_dist), -recovery_clamp), recovery_clamp) : c * (m_cur_dist - m_dist);

    Qc(off_L + 0) += cnstr_par1_violation;
    Qc(off_L + 1) += cnstr_par2_violation;
    Qc(off_L + 2) += cnstr_dot_violation;
    Qc(off_L + 3) += cnstr_dist_violation;
}